

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extreme_value_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::extreme_value_dist<float>::cdf(extreme_value_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar1;
  result_type_conflict1 rVar2;
  double dVar3;
  
  rVar1 = param_type::eta(in_RDI);
  rVar2 = param_type::theta(in_RDI);
  dVar3 = std::exp((double)(ulong)(uint)((in_XMM0_Da - rVar1) / rVar2));
  dVar3 = std::exp((double)(ulong)(SUB84(dVar3,0) ^ 0x80000000));
  return 1.0 - SUB84(dVar3,0);
}

Assistant:

cdf(result_type x) const {
      x -= P.eta();
      x /= P.theta();
      return 1 - math::exp(-math::exp(x));
    }